

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O1

bool findDirs(string *path,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *dirsList)

{
  char *__s;
  dirent64 *pdVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  dirent **namelist;
  string dirName;
  dirent64 **local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirsList;
  local_58 = path;
  uVar3 = scandir64((path->_M_dataplus)._M_p,&local_a8,(__selector *)0x0,(__cmp *)0x0);
  if (-1 < (int)uVar3) {
    if (uVar3 != 0) {
      uVar8 = (ulong)uVar3;
      do {
        if (local_a8[uVar8 - 1]->d_type == '\x04') {
          pdVar1 = local_a8[uVar8 - 1];
          __s = pdVar1->d_name;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,__s,pdVar1->d_name + sVar5);
          iVar4 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&local_80);
            if (iVar4 != 0) {
              std::operator+(&local_50,local_58,&local_80);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_a0.field_2._M_allocated_capacity = *psVar7;
                local_a0.field_2._8_8_ = plVar6[3];
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar7;
                local_a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_60,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        lVar2 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        free(local_a8[lVar2]);
      } while (uVar8 != 0);
    }
    free(local_a8);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool findDirs(const string& path, vector<string>* dirsList)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_DIR)
            {
                string dirName(namelist[n]->d_name);

                // we save only normal ones
                if ("." != dirName && ".." != dirName)
                    dirsList->push_back(path + dirName + "/");
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}